

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O3

void duckdb::GenerateUUIDv7Function(DataChunk *args,ExpressionState *state,Vector *result)

{
  optional_ptr<duckdb::FunctionLocalState,_true> oVar1;
  ulong uVar2;
  int64_t *piVar3;
  hugeint_t hVar4;
  optional_ptr<duckdb::FunctionLocalState,_true> local_28;
  
  local_28.ptr = (FunctionLocalState *)state[1]._vptr_ExpressionState;
  optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid(&local_28);
  oVar1.ptr = local_28.ptr;
  Vector::SetVectorType(result,FLAT_VECTOR);
  if (args->count != 0) {
    piVar3 = (int64_t *)(result->data + 8);
    uVar2 = 0;
    do {
      hVar4 = UUIDv7::GenerateRandomUUID((RandomEngine *)(oVar1.ptr + 1));
      piVar3[-1] = hVar4.lower;
      *piVar3 = hVar4.upper;
      uVar2 = uVar2 + 1;
      piVar3 = piVar3 + 2;
    } while (uVar2 < args->count);
  }
  return;
}

Assistant:

static void GenerateUUIDv7Function(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 0);
	auto &lstate = ExecuteFunctionState::GetFunctionState(state)->Cast<RandomLocalState>();

	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto result_data = FlatVector::GetData<hugeint_t>(result);

	for (idx_t i = 0; i < args.size(); i++) {
		result_data[i] = UUIDv7::GenerateRandomUUID(lstate.random_engine);
	}
}